

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

upb_MiniTable *
upb_MiniTable_BuildWithBuf
          (char *data,size_t len,upb_MiniTablePlatform platform,upb_Arena *arena,void **buf,
          size_t *buf_size,upb_Status *status)

{
  upb_MiniTable *puVar1;
  upb_MtDecoder decoder;
  upb_MtDecoder local_140;
  
  memset(&local_140,0,0x110);
  local_140.base.status = status;
  local_140.table = (upb_MiniTable *)arena->ptr_dont_copy_me__upb_internal_use_only;
  if ((ulong)((long)arena->end_dont_copy_me__upb_internal_use_only - (long)local_140.table) < 0x18)
  {
    local_140.table =
         (upb_MiniTable *)_upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(arena,0x18);
  }
  else {
    if ((upb_MiniTable *)
        ((ulong)((long)&(local_140.table)->subs_dont_copy_me__upb_internal_use_only + 7U) &
        0xfffffffffffffff8) != local_140.table) {
      __assert_fail("((((uintptr_t)ret) + (8) - 1) / (8) * (8)) == (uintptr_t)ret",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/mem/internal/arena.h"
                    ,0x3f,"void *upb_Arena_Malloc(struct upb_Arena *, size_t)");
    }
    arena->ptr_dont_copy_me__upb_internal_use_only = (char *)(local_140.table + 1);
  }
  local_140.vec.data = (upb_LayoutItem *)*buf;
  local_140.vec.capacity = *buf_size / 0xc;
  local_140.platform = platform;
  local_140.arena = arena;
  puVar1 = upb_MtDecoder_BuildMiniTableWithBuf(&local_140,data,len,buf,buf_size);
  return puVar1;
}

Assistant:

upb_MiniTable* upb_MiniTable_BuildWithBuf(const char* data, size_t len,
                                          upb_MiniTablePlatform platform,
                                          upb_Arena* arena, void** buf,
                                          size_t* buf_size,
                                          upb_Status* status) {
  upb_MtDecoder decoder = {
      .base = {.status = status},
      .platform = platform,
      .vec =
          {
              .data = *buf,
              .capacity = *buf_size / sizeof(*decoder.vec.data),
              .size = 0,
          },
      .arena = arena,
      .table = upb_Arena_Malloc(arena, sizeof(*decoder.table)),
  };

  return upb_MtDecoder_BuildMiniTableWithBuf(&decoder, data, len, buf,
                                             buf_size);
}